

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_bind_string.c
# Opt level: O2

int mpt_output_bind_string(mpt_output *out,char *descr)

{
  uint8_t uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  char *pcVar6;
  bool bVar7;
  mpt_msgtype mt;
  undefined4 local_48;
  undefined2 local_44;
  mpt_strdest str;
  
  iVar4 = -1;
  if (out != (mpt_output *)0x0) {
    local_44 = 1;
    local_48 = 0x1010700;
    str.change = '\x03';
    mt.cmd = '\f';
    mt.arg = '0';
    if (descr == (char *)0x0) {
      mt.cmd = '\f';
      mt.arg = '1';
      iVar4 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
      if (iVar4 < 0) {
        iVar4 = -2;
      }
      else {
        sVar5 = (*out->_vptr->push)(out,2,&mt);
        iVar4 = (int)sVar5;
        if (-1 < (int)sVar5) {
          sVar5 = (*out->_vptr->push)(out,0,(void *)0x0);
          iVar4 = 0;
          if ((int)sVar5 < 0) {
            (*out->_vptr->push)(out,1,(void *)0x0);
            iVar4 = (int)sVar5;
          }
        }
      }
    }
    else {
      iVar4 = 1;
      do {
        while( true ) {
          uVar2 = mpt_string_dest(&str,0x3a,descr);
          if (uVar2 == 0) {
            iVar4 = 0;
            goto LAB_00108189;
          }
          if ((int)uVar2 < 0) {
            mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s","bad data destination",
                           (local_48 & 0xff) + 1,descr);
            return iVar4 + -1;
          }
          pcVar6 = "identical data destination";
          if (str.change != '\0') break;
LAB_0010804f:
          mpt_output_log(out,"mpt_output_bind_string",3,"%s: %d: %s",pcVar6,(local_48 & 0xff) + 1,
                         descr);
          descr = descr + uVar2;
        }
        if ((str.change & 1) != 0) {
          local_48._0_3_ = CONCAT12(str.val[0],(undefined2)local_48);
        }
        if ((str.change & 2) != 0) {
          local_48 = CONCAT13(str.val[1],(undefined3)local_48);
        }
        if ((str.change & 4) == 0) {
          uVar1 = (uint8_t)local_44;
        }
        else {
          local_44 = CONCAT11(local_44._1_1_,str.val[2]);
          uVar1 = str.val[2];
        }
        pcVar6 = "illegal data destination";
        if (local_48._2_1_ == '\0') goto LAB_0010804f;
        pcVar6 = "illegal data destination";
        if ((local_48._3_1_ == '\0') || (pcVar6 = "illegal data destination", uVar1 == '\0'))
        goto LAB_0010804f;
        if (mt.cmd != '\0') {
          iVar3 = (*out->_vptr->await)(out,(_func_int_void_ptr_mpt_message_ptr *)0x0,(void *)0x0);
          if (iVar3 < 0) {
            return -2;
          }
          sVar5 = (*out->_vptr->push)(out,2,&mt);
          if ((int)sVar5 < 0) {
            return (int)sVar5;
          }
          mt = (mpt_msgtype)((ushort)mt & 0xff00);
        }
        local_48 = local_48 & 0xffffff00;
        local_44 = local_44 & 0xff;
        sVar5 = (*out->_vptr->push)(out,6,&local_48);
        if ((int)sVar5 < 0) goto LAB_0010819a;
        local_48 = CONCAT31(local_48._1_3_,(char)iVar4);
        local_44 = CONCAT11(1,(uint8_t)local_44);
        sVar5 = (*out->_vptr->push)(out,6,&local_48);
        if ((int)sVar5 < 0) goto LAB_0010819a;
        str.change = '\x03';
        bVar7 = iVar4 != 0xff;
        descr = descr + uVar2;
        iVar4 = iVar4 + 1;
      } while (bVar7);
      iVar4 = 0xff;
LAB_00108189:
      sVar5 = (*out->_vptr->push)(out,0,(void *)0x0);
      if (sVar5 < 0) {
LAB_0010819a:
        (*out->_vptr->push)(out,1,(void *)0x0);
        iVar4 = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

extern int mpt_output_bind_string(MPT_INTERFACE(output) *out, const char *descr)
{
	MPT_STRUCT(strdest) str;
	MPT_STRUCT(msgtype) mt;
	struct {
		MPT_STRUCT(valsrc)  src;
		MPT_STRUCT(laydest) dst;
	} bnd;
	int len, dim = 1;
	
	if (!out) {
		return MPT_ERROR(BadArgument);
	}
	
	bnd.src.dim = 0;
	bnd.src.state = MPT_DATASTATE(All);
	
	bnd.dst.lay = bnd.dst.grf = bnd.dst.wld = 1;
	bnd.dst.dim = 0;
	
	str.change = 3;
	
	mt.cmd = MPT_MESGTYPE(Graphic);
	mt.arg = MPT_MESGGRF(BindingAdd);
	
	if (!descr) {
		mt.arg = MPT_MESGGRF(BindingClear);
		if (out->_vptr->await(out, 0, 0) < 0) {
			return -2;
		}
		if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
			return len;
		}
		if ((len = out->_vptr->push(out, 0, 0)) < 0) {
			out->_vptr->push(out, 1, 0);
			return len;
		}
		return 0;
	}
	/* read binding description string */
	while ((len = mpt_string_dest(&str, ':', descr))) {
		if (len < 0) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                      MPT_tr("bad data destination"), bnd.src.dim+1, descr);
			return dim - 1;
		}
		descr += len;
		if (!str.change) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("identical data destination"), bnd.src.dim+1, descr-len);
			continue;
		}
		if (str.change & 1) bnd.dst.lay = str.val[0];
		if (str.change & 2) bnd.dst.grf = str.val[1];
		if (str.change & 4) bnd.dst.wld = str.val[2];
		
		if (!bnd.dst.lay || !bnd.dst.grf || !bnd.dst.wld) {
			(void) mpt_output_log(out, __func__, MPT_LOG(Error), "%s: %d: %s",
			                       MPT_tr("illegal data destination"), bnd.src.dim+1, descr - len);
			continue;
		}
		/* register/write header on first occasion */
		if (mt.cmd) {
			if (out->_vptr->await(out, 0, 0) < 0) {
				return -2;
			}
			if ((len = out->_vptr->push(out, sizeof(mt), &mt)) < 0) {
				return len;
			}
			mt.cmd = 0;
		}
		/* append x/y data bindings */
		bnd.src.dim = 0;
		bnd.dst.dim = 0;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		bnd.src.dim = dim;
		bnd.dst.dim = 1;
		if ((len = out->_vptr->push(out, sizeof(bnd), &bnd)) < 0) break;
		
		str.change = 3;
		
		if ((len = dim++) == UINT8_MAX) break;
	}
	/* clear message data and registration */
	if (len < 0 || out->_vptr->push(out, 0, 0) < 0) {
		out->_vptr->push(out, 1, 0);
		return -1;
	}
	return len;
}